

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

string * tinyusdz::escapeControlSequence(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = str->_M_string_length;
  if (uVar3 != 0) {
    uVar4 = 1;
    do {
      pcVar2 = (str->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar4 - 1];
      switch(cVar1) {
      case '\a':
        break;
      case '\b':
        break;
      case '\t':
        break;
      case '\n':
switchD_002a34c1_caseD_a:
        goto LAB_002a34f8;
      case '\v':
        break;
      case '\f':
        break;
      default:
        if (cVar1 != '\\') goto switchD_002a34c1_caseD_a;
        if ((uVar3 <= uVar4) || ((cVar1 = pcVar2[uVar4], cVar1 != '\'' && (cVar1 != '\"')))) break;
LAB_002a34f8:
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        goto LAB_002a3536;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002a3536:
      uVar3 = str->_M_string_length;
      bVar5 = uVar4 < uVar3;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeControlSequence(const std::string &str) {
  std::string s;

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\a') {
      s += "\\x07";
    } else if (str[i] == '\b') {
      s += "\\x08";
    } else if (str[i] == '\t') {
      s += "\\t";
    } else if (str[i] == '\v') {
      s += "\\x0b";
    } else if (str[i] == '\f') {
      s += "\\x0c";
    } else if (str[i] == '\\') {
      // skip escaping backshash for escaped quote string: \' \"
      if (i + 1 < str.size()) {
        if ((str[i + 1] == '"') || (str[i + 1] == '\'')) {
          s += str[i];
        } else {
          s += "\\\\";
        }
      } else {
        s += "\\\\";
      }
    } else {
      s += str[i];
    }
  }

  return s;
}